

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_change_meta(lyd_meta *meta,char *val_str)

{
  char *__s;
  lys_module *mod;
  lysc_type *plVar1;
  undefined8 uVar2;
  LY_ERR LVar3;
  size_t name_len;
  size_t value_len;
  lysc_node *ctx_node;
  char *pcVar4;
  lyd_meta *m2;
  lyd_value val;
  
  m2 = (lyd_meta *)0x0;
  if (meta == (lyd_meta *)0x0) {
    LVar3 = LY_EINVAL;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","meta","lyd_change_meta");
  }
  else {
    pcVar4 = "";
    if (val_str != (char *)0x0) {
      pcVar4 = val_str;
    }
    __s = meta->name;
    mod = meta->annotation->module;
    name_len = strlen(__s);
    value_len = strlen(pcVar4);
    if (meta->parent == (lyd_node *)0x0) {
      ctx_node = (lysc_node *)0x0;
    }
    else {
      ctx_node = meta->parent->schema;
    }
    LVar3 = lyd_create_meta((lyd_node *)0x0,&m2,mod,__s,name_len,pcVar4,value_len,'\0','\0',
                            (ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,0x3f3,ctx_node,'\0',
                            (ly_bool *)0x0);
    if (LVar3 == LY_SUCCESS) {
      LVar3 = lyd_compare_meta(meta,m2);
      if (LVar3 == LY_SUCCESS) {
        LVar3 = LY_ENOT;
      }
      else {
        val.field_2._16_8_ = *(undefined8 *)((long)&(meta->value).field_2 + 0x10);
        val._canonical = (meta->value)._canonical;
        val.realtype = (meta->value).realtype;
        val.field_2.dec64 = (meta->value).field_2.dec64;
        val.field_2._8_8_ = *(undefined8 *)((long)&(meta->value).field_2 + 8);
        *(undefined8 *)((long)&(meta->value).field_2 + 0x10) =
             *(undefined8 *)((long)&(m2->value).field_2 + 0x10);
        pcVar4 = (m2->value)._canonical;
        plVar1 = (m2->value).realtype;
        uVar2 = *(undefined8 *)((long)&(m2->value).field_2 + 8);
        (meta->value).field_2.dec64 = (m2->value).field_2.dec64;
        *(undefined8 *)((long)&(meta->value).field_2 + 8) = uVar2;
        (meta->value)._canonical = pcVar4;
        (meta->value).realtype = plVar1;
        *(undefined8 *)((long)&(m2->value).field_2 + 0x10) = val.field_2._16_8_;
        (m2->value).field_2.dec64 = val.field_2.dec64;
        *(undefined8 *)((long)&(m2->value).field_2 + 8) = val.field_2._8_8_;
        (m2->value)._canonical = val._canonical;
        (m2->value).realtype = val.realtype;
        LVar3 = LY_SUCCESS;
      }
    }
    lyd_free_meta_single(m2);
  }
  return LVar3;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_change_meta(struct lyd_meta *meta, const char *val_str)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_meta *m2 = NULL;
    struct lyd_value val;
    ly_bool val_change;

    LY_CHECK_ARG_RET(NULL, meta, LY_EINVAL);

    if (!val_str) {
        val_str = "";
    }

    /* parse the new value into a new meta structure */
    ret = lyd_create_meta(NULL, &m2, meta->annotation->module, meta->name, strlen(meta->name), val_str, strlen(val_str),
            0, 0, NULL, LY_VALUE_JSON, NULL, LYD_HINT_DATA, meta->parent ? meta->parent->schema : NULL, 0, NULL);
    LY_CHECK_GOTO(ret, cleanup);

    /* compare original and new value */
    if (lyd_compare_meta(meta, m2)) {
        /* values differ, switch them */
        val = meta->value;
        meta->value = m2->value;
        m2->value = val;
        val_change = 1;
    } else {
        val_change = 0;
    }

    /* retrun value */
    if (!val_change) {
        /* no change */
        ret = LY_ENOT;
    } /* else value changed, LY_SUCCESS */

cleanup:
    lyd_free_meta_single(m2);
    return ret;
}